

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Data_Query_PDU::Data_Query_PDU(Data_Query_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Data_Query_PDU_00221e98;
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeInterval);
  (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,0);
  return;
}

Assistant:

Data_Query_PDU::Data_Query_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}